

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger container_update(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  long idx;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase);
  if (((pSVar3->super_SQObject)._flags & 1) != 0) {
    SVar5 = sq_throwerror(v,"Cannot modify immutable object");
    return SVar5;
  }
  SVar4 = sq_gettop(v);
  if (1 < SVar4) {
    idx = 2;
    do {
      SVar2 = sq_gettype(v,idx);
      if ((SVar2 & 0xc020) == 0) {
        SQVM::Raise_ParamTypeError(v,idx,0xc020,(ulong)SVar2);
      }
      else {
        sq_pushnull(v);
        while (SVar5 = sq_next(v,idx), -1 < SVar5) {
          sq_newslot(v,1,0);
        }
        sq_pop(v,1);
      }
      if ((SVar2 & 0xc020) == 0) {
        return -1;
      }
      bVar1 = idx < SVar4;
      idx = idx + 1;
    } while (bVar1);
  }
  sq_push(v,1);
  return 1;
}

Assistant:

static SQInteger container_update(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQInteger top = sq_gettop(v);
    for (int arg=2; arg<=top; ++arg) {
        SQObjectType argType = sq_gettype(v, arg);
        if (!(argType & (_RT_TABLE | _RT_CLASS | _RT_INSTANCE))) {
            v->Raise_ParamTypeError(arg, _RT_TABLE | _RT_CLASS | _RT_INSTANCE, argType);
            return SQ_ERROR;
        }

        sq_pushnull(v);
        while (SQ_SUCCEEDED(sq_next(v, arg))) {
            sq_newslot(v, 1, false);
        }
        sq_pop(v, 1); // pops the iterator
    }
    sq_push(v, 1);
    return 1;
}